

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QByteArray * qt_convert_to_local_8bit(QByteArray *__return_storage_ptr__,QStringView string)

{
  QByteArray *pQVar1;
  long in_FS_OFFSET;
  QStringEncoder local_48;
  QByteArray *local_10;
  
  local_10 = *(QByteArray **)(in_FS_OFFSET + 0x28);
  if (string.m_data == (storage_type_conflict *)0x0) {
    pQVar1 = *(QByteArray **)(in_FS_OFFSET + 0x28);
    if (pQVar1 == local_10) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return pQVar1;
    }
  }
  else {
    local_48.super_QStringConverter.iface = QStringConverter::encodingInterfaces + 2;
    local_48.super_QStringConverter.state.flags.super_QFlagsStorageHelper<QStringConverter::Flag,_4>
    .super_QFlagsStorage<QStringConverter::Flag>.i =
         (QFlagsStorageHelper<QStringConverter::Flag,_4>)(QFlagsStorage<QStringConverter::Flag>)0x1;
    local_48.super_QStringConverter.state._4_8_ = 0;
    local_48.super_QStringConverter.state._12_8_ = 0;
    local_48.super_QStringConverter.state._20_8_ = 0;
    local_48.super_QStringConverter.state.field_4.state_data[1] = 0;
    local_48.super_QStringConverter.state.field_4.state_data[2] = 0;
    local_48.super_QStringConverter.state.field_4.state_data[3] = 0;
    local_48.super_QStringConverter.state.clearFn = (ClearDataFn)0x0;
    QStringEncoder::encodeAsByteArray(__return_storage_ptr__,&local_48,string);
    QStringConverter::State::clear(&local_48.super_QStringConverter.state);
    if (*(QByteArray **)(in_FS_OFFSET + 0x28) == local_10) {
      return *(QByteArray **)(in_FS_OFFSET + 0x28);
    }
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray qt_convert_to_local_8bit(QStringView string)
{
    if (string.isNull())
        return QByteArray();
    QStringEncoder fromUtf16(QStringEncoder::System, QStringEncoder::Flag::Stateless);
    return fromUtf16(string);
}